

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O3

void hexdump(zip_uint8_t *data,zip_uint16_t len)

{
  undefined6 in_register_00000032;
  ulong uVar1;
  
  if ((int)CONCAT62(in_register_00000032,len) != 0) {
    printf("0x");
    uVar1 = 0;
    do {
      printf("%02x",(ulong)data[uVar1]);
      uVar1 = uVar1 + 1;
    } while (len != uVar1);
  }
  return;
}

Assistant:

static void
hexdump(const zip_uint8_t *data, zip_uint16_t len) {
    zip_uint16_t i;

    if (len <= 0)
	return;

    printf("0x");

    for (i = 0; i < len; i++)
	printf("%02x", data[i]);

    return;
}